

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_count.cpp
# Opt level: O2

void duckdb::ApproxCountDistinctUpdateFunction
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  InternalException *this;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  LogicalType local_180 [24];
  UnifiedVectorFormat sdata;
  long local_160;
  UnifiedVectorFormat hdata;
  long local_118;
  Vector hash_vec;
  UnifiedVectorFormat idata;
  long local_60;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&idata);
  duckdb::Vector::ToUnifiedFormat((ulong)inputs,(UnifiedVectorFormat *)count);
  if (count < 0x801) {
    duckdb::LogicalType::LogicalType(local_180,UBIGINT);
    duckdb::Vector::Vector(&hash_vec,local_180,count);
    duckdb::LogicalType::~LogicalType(local_180);
    duckdb::VectorOperations::Hash(inputs,&hash_vec,count);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&sdata);
    duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&hdata);
    duckdb::Vector::ToUnifiedFormat((ulong)&hash_vec,(UnifiedVectorFormat *)count);
    for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
      uVar7 = uVar4;
      if (*_idata != 0) {
        uVar7 = (ulong)*(uint *)(*_idata + uVar4 * 4);
      }
      if ((local_60 == 0) || ((*(ulong *)(local_60 + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f) & 1) != 0))
      {
        uVar7 = uVar4;
        if (*_sdata != 0) {
          uVar7 = (ulong)*(uint *)(*_sdata + uVar4 * 4);
        }
        uVar6 = uVar4;
        if (*_hdata != 0) {
          uVar6 = (ulong)*(uint *)(*_hdata + uVar4 * 4);
        }
        lVar2 = *(long *)(local_160 + uVar7 * 8);
        uVar7 = *(ulong *)(local_118 + uVar6 * 8);
        uVar6 = (ulong)((uint)uVar7 & 0x3f);
        uVar7 = uVar7 >> 6 | 0x400000000000000;
        lVar3 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        bVar5 = (char)lVar3 + 1;
        bVar1 = *(byte *)(lVar2 + uVar6);
        if (bVar5 < bVar1) {
          bVar5 = bVar1;
        }
        *(byte *)(lVar2 + uVar6) = bVar5;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&hdata);
    UnifiedVectorFormat::~UnifiedVectorFormat(&sdata);
    Vector::~Vector(&hash_vec);
    UnifiedVectorFormat::~UnifiedVectorFormat(&idata);
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&hash_vec,"ApproxCountDistinct - count must be at most vector size",
             (allocator *)&sdata);
  duckdb::InternalException::InternalException(this,(string *)&hash_vec);
  __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void ApproxCountDistinctUpdateFunction(Vector inputs[], AggregateInputData &, idx_t input_count,
                                              Vector &state_vector, idx_t count) {
	D_ASSERT(input_count == 1);
	auto &input = inputs[0];
	UnifiedVectorFormat idata;
	input.ToUnifiedFormat(count, idata);

	if (count > STANDARD_VECTOR_SIZE) {
		throw InternalException("ApproxCountDistinct - count must be at most vector size");
	}
	Vector hash_vec(LogicalType::HASH, count);
	VectorOperations::Hash(input, hash_vec, count);

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	const auto states = UnifiedVectorFormat::GetDataNoConst<ApproxDistinctCountState *>(sdata);

	UnifiedVectorFormat hdata;
	hash_vec.ToUnifiedFormat(count, hdata);
	const auto *hashes = UnifiedVectorFormat::GetData<hash_t>(hdata);
	for (idx_t i = 0; i < count; i++) {
		if (idata.validity.RowIsValid(idata.sel->get_index(i))) {
			auto agg_state = states[sdata.sel->get_index(i)];
			const auto hash = hashes[hdata.sel->get_index(i)];
			agg_state->hll.InsertElement(hash);
		}
	}
}